

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

_Bool arena_ralloc_no_move
                (tsdn_t *tsdn,void *ptr,size_t oldsize,size_t size,size_t extra,_Bool zero,
                size_t *newsize)

{
  ulong *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  int iVar4;
  arena_t *arena;
  ulong uVar5;
  undefined8 uVar6;
  _Bool _Var7;
  szind_t sVar8;
  uint uVar9;
  ticker_t *ptVar10;
  ulong uVar11;
  size_t usize_min;
  ulong uVar12;
  long lVar13;
  rtree_leaf_elm_t *prVar14;
  extent_t *extent;
  rtree_ctx_t *ctx;
  size_t usize_max;
  rtree_ctx_t rtree_ctx_fallback;
  
  if (tsdn == (tsdn_t *)0x0) {
    ctx = &rtree_ctx_fallback;
    rtree_ctx_data_init(ctx);
  }
  else {
    ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar11 = (ulong)ptr & 0xffffffffc0000000;
  uVar12 = (ulong)(((uint)((ulong)ptr >> 0x1e) & 0xf) << 4);
  puVar1 = (ulong *)((long)&ctx->cache[0].leafkey + uVar12);
  uVar12 = *(ulong *)((long)&ctx->cache[0].leafkey + uVar12);
  if (uVar12 == uVar11) {
    prVar14 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar1[1]);
  }
  else if (ctx->l2_cache[0].leafkey == uVar11) {
    prVar14 = ctx->l2_cache[0].leaf;
    ctx->l2_cache[0].leafkey = uVar12;
    ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar1[1];
    *puVar1 = uVar11;
    puVar1[1] = (ulong)prVar14;
    prVar14 = (rtree_leaf_elm_t *)
              ((long)&(prVar14->le_bits).repr + (ulong)((uint)ptr >> 9 & 0x1ffff8));
  }
  else {
    for (lVar13 = 0x118; lVar13 != 0x188; lVar13 = lVar13 + 0x10) {
      if (*(ulong *)((long)ctx->cache + lVar13 + -8) == uVar11) {
        uVar5 = *(ulong *)((long)&ctx->cache[0].leafkey + lVar13);
        puVar2 = (undefined8 *)((long)ctx->cache + lVar13 + -0x18);
        uVar6 = puVar2[1];
        puVar3 = (undefined8 *)((long)ctx->cache + lVar13 + -8);
        *puVar3 = *puVar2;
        puVar3[1] = uVar6;
        *(ulong *)((long)ctx->cache + lVar13 + -0x18) = uVar12;
        *(ulong *)((long)(ctx->cache + -1) + lVar13) = puVar1[1];
        *puVar1 = uVar11;
        puVar1[1] = uVar5;
        prVar14 = (rtree_leaf_elm_t *)(((uint)ptr >> 9 & 0x1ffff8) + uVar5);
        goto LAB_001103a5;
      }
    }
    prVar14 = rtree_leaf_elm_lookup_hard(tsdn,&extents_rtree,ctx,(uintptr_t)ptr,true,false);
  }
LAB_001103a5:
  extent = (extent_t *)(((long)(prVar14->le_bits).repr << 0x10) >> 0x10 & 0xfffffffffffffffe);
  _Var7 = true;
  if (0x7000000000000000 < size) goto LAB_001104ef;
  if (size < 0x1001) {
    usize_min = sz_index2size_tab[sz_size2index_tab[size + 7 >> 3]];
  }
  else {
    uVar12 = size * 2 - 1;
    lVar13 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar13 == 0; lVar13 = lVar13 + -1) {
      }
    }
    uVar12 = ~(-1L << ((char)lVar13 - 3U & 0x3f));
    if ((uint)lVar13 < 7) {
      uVar12 = 0xf;
    }
    usize_min = ~uVar12 & uVar12 + size;
  }
  uVar12 = extra + size;
  if (uVar12 < 0x1001) {
    usize_max = sz_index2size_tab[sz_size2index_tab[uVar12 + 7 >> 3]];
  }
  else if (uVar12 < 0x7000000000000001) {
    uVar11 = uVar12 * 2 - 1;
    lVar13 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar13 == 0; lVar13 = lVar13 + -1) {
      }
    }
    uVar11 = ~(-1L << ((char)lVar13 - 3U & 0x3f));
    if ((uint)lVar13 < 7) {
      uVar11 = 0xf;
    }
    usize_max = ~uVar11 & uVar12 + uVar11;
  }
  else {
    usize_max = 0;
  }
  if ((0x3800 < oldsize) || (0x3800 < usize_min)) {
    if ((0x3fff < oldsize) && (0x3fff < usize_max)) {
      _Var7 = large_ralloc_no_move(tsdn,extent,usize_min,usize_max,zero);
    }
    goto LAB_001104ef;
  }
  if (usize_max < 0x3801) {
    if (usize_max < 0x1001) {
      sVar8 = (szind_t)sz_size2index_tab[usize_max + 7 >> 3];
    }
    else {
      sVar8 = sz_size2index_compute(usize_max);
    }
    if (oldsize < 0x1001) {
      uVar9 = (uint)sz_size2index_tab[oldsize + 7 >> 3];
    }
    else {
      uVar9 = sz_size2index_compute(oldsize);
    }
    if (sVar8 != uVar9) goto LAB_0011049a;
  }
  else {
LAB_0011049a:
    _Var7 = true;
    if ((oldsize < size) || (usize_max < oldsize)) goto LAB_001104ef;
  }
  arena = (arena_t *)arenas[(uint)extent->e_bits & 0xfff].repr;
  if (tsdn == (tsdn_t *)0x0) {
LAB_001104ec:
    _Var7 = false;
  }
  else {
    ptVar10 = decay_ticker_get(&tsdn->tsd,arena->base->ind);
    if (ptVar10 != (ticker_t *)0x0) {
      iVar4 = ptVar10->tick;
      ptVar10->tick = iVar4 + -1;
      if (0 < iVar4) goto LAB_001104ec;
      ptVar10->tick = ptVar10->nticks;
      arena_decay(tsdn,arena,false,false);
    }
    _Var7 = false;
  }
LAB_001104ef:
  *newsize = *(size_t *)((long)sz_index2size_tab + (ulong)((uint)extent->e_bits >> 0xf & 0x7f8));
  return _Var7;
}

Assistant:

bool
arena_ralloc_no_move(tsdn_t *tsdn, void *ptr, size_t oldsize, size_t size,
    size_t extra, bool zero, size_t *newsize) {
	bool ret;
	/* Calls with non-zero extra had to clamp extra. */
	assert(extra == 0 || size + extra <= SC_LARGE_MAXCLASS);

	extent_t *extent = iealloc(tsdn, ptr);
	if (unlikely(size > SC_LARGE_MAXCLASS)) {
		ret = true;
		goto done;
	}

	size_t usize_min = sz_s2u(size);
	size_t usize_max = sz_s2u(size + extra);
	if (likely(oldsize <= SC_SMALL_MAXCLASS && usize_min
	    <= SC_SMALL_MAXCLASS)) {
		/*
		 * Avoid moving the allocation if the size class can be left the
		 * same.
		 */
		assert(bin_infos[sz_size2index(oldsize)].reg_size ==
		    oldsize);
		if ((usize_max > SC_SMALL_MAXCLASS
		    || sz_size2index(usize_max) != sz_size2index(oldsize))
		    && (size > oldsize || usize_max < oldsize)) {
			ret = true;
			goto done;
		}

		arena_decay_tick(tsdn, extent_arena_get(extent));
		ret = false;
	} else if (oldsize >= SC_LARGE_MINCLASS
	    && usize_max >= SC_LARGE_MINCLASS) {
		ret = large_ralloc_no_move(tsdn, extent, usize_min, usize_max,
		    zero);
	} else {
		ret = true;
	}
done:
	assert(extent == iealloc(tsdn, ptr));
	*newsize = extent_usize_get(extent);

	return ret;
}